

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void tcp_pinger_new(int vectored_writes)

{
  int iVar1;
  uchar *puVar2;
  uv_loop_t *loop;
  pinger_t *pinger;
  sockaddr_in server_addr;
  int r;
  int vectored_writes_local;
  
  server_addr.sin_zero._4_4_ = vectored_writes;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)&pinger);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0xcd,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &server_addr)");
    abort();
  }
  puVar2 = (uchar *)malloc(0x2978);
  if (puVar2 == (uchar *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0xcf,"pinger != NULL");
    abort();
  }
  *(undefined4 *)puVar2 = server_addr.sin_zero._4_4_;
  puVar2[8] = '\0';
  puVar2[9] = '\0';
  puVar2[10] = '\0';
  puVar2[0xb] = '\0';
  puVar2[4] = '\0';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  loop = uv_default_loop();
  server_addr.sin_zero._0_4_ = uv_tcp_init(loop,(uv_tcp_t *)(puVar2 + 0x10));
  *(uchar **)(puVar2 + 0x10) = puVar2;
  if (server_addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0xd7,"!r");
    abort();
  }
  server_addr.sin_zero._0_4_ =
       uv_tcp_connect((uv_connect_t *)(puVar2 + 0x118),(uv_tcp_t *)(puVar2 + 0x10),
                      (sockaddr *)&pinger,pinger_on_connect);
  if (server_addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0xdf,"!r");
    abort();
  }
  if (pinger_on_connect_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0xe2,"pinger_on_connect_count == 0");
    abort();
  }
  return;
}

Assistant:

static void tcp_pinger_new(int vectored_writes) {
  int r;
  struct sockaddr_in server_addr;
  pinger_t *pinger;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &server_addr));
  pinger = malloc(sizeof(*pinger));
  ASSERT(pinger != NULL);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_tcp_init(uv_default_loop(), &pinger->stream.tcp);
  pinger->stream.tcp.data = pinger;
  ASSERT(!r);

  /* We are never doing multiple reads/connects at a time anyway, so these
   * handles can be pre-initialized. */
  r = uv_tcp_connect(&pinger->connect_req,
                     &pinger->stream.tcp,
                     (const struct sockaddr*) &server_addr,
                     pinger_on_connect);
  ASSERT(!r);

  /* Synchronous connect callbacks are not allowed. */
  ASSERT(pinger_on_connect_count == 0);
}